

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O3

void GA_Print_patch(int g_a,int ilo,int ihi,int jlo,int jhi,int pretty)

{
  Integer _ga_hi [7];
  Integer _ga_lo [7];
  Integer IStack_78;
  long local_70;
  long local_38;
  long local_30;
  
  local_30 = (long)ilo + 1;
  local_38 = (long)jhi + 1;
  local_70 = (long)ihi + 1;
  pnga_print_patch((long)g_a,&local_38,&IStack_78,(long)pretty);
  return;
}

Assistant:

void GA_Print_patch(int g_a,int ilo,int ihi,int jlo,int jhi,int pretty)
{
    Integer a = (Integer)g_a;
    Integer lo[2];
    Integer hi[2];
    Integer p = (Integer) pretty;
    Integer _ga_lo[MAXDIM], _ga_hi[MAXDIM];

    lo[0] = ilo; lo[1] = jlo;
    hi[0] = ihi; lo[1] = jhi;
    COPYINDEX_C2F(lo,_ga_lo,2);
    COPYINDEX_C2F(hi,_ga_hi,2);
    wnga_print_patch(a, _ga_lo, _ga_hi, p);
}